

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O1

bool xercesc_4_0::XMLString::equals(char *str1,char *str2)

{
  char cVar1;
  char cVar2;
  
  if (str1 == str2) {
    return true;
  }
  if (str2 == (char *)0x0 || str1 == (char *)0x0) {
    if (str1 == (char *)0x0) {
      if (str2 == (char *)0x0) {
        return true;
      }
    }
    else if (*str1 != '\0' || str2 == (char *)0x0) {
      return *str1 == '\0';
    }
  }
  else {
    while (cVar1 = *str1, cVar1 != '\0') {
      str1 = str1 + 1;
      cVar2 = *str2;
      str2 = str2 + 1;
      if (cVar1 != cVar2) {
        return false;
      }
    }
  }
  return *str2 == '\0';
}

Assistant:

inline bool XMLString::equals(   const char* str1
                               , const char* str2)
{
    if (str1 == str2)
        return true;

    if (str1 == 0 || str2 == 0)
        return ((!str1 || !*str1) && (!str2 || !*str2));

    while (*str1)
        if(*str1++ != *str2++)  // they are different (or str2 is shorter and we hit the NULL)
            return false;

    // either both ended (and *str2 is 0 too), or str2 is longer
    return (*str2==0);
}